

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belief.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,Belief *belief)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*belief->_vptr_Belief[4])(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Belief& belief) {
	os << (&belief)->text();
	return os;
}